

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * RPLIDARExpressScanThread(void *pParam)

{
  _Map_pointer ppdVar1;
  uint uVar2;
  size_type sVar3;
  reference pdVar4;
  deque<double,_std::allocator<double>_> *this;
  long lVar5;
  deque<double,_std::allocator<double>_> *this_00;
  uint uVar6;
  long lVar7;
  int iVar8;
  CRITICAL_SECTION *pCVar9;
  _Deque_iterator<double,_double_&,_double_*> *this_01;
  BOOL bNewScan;
  double angles [32];
  double distances [32];
  uint local_278;
  BOOL local_274;
  void *local_270;
  _Deque_iterator<double,_double_&,_double_*> *local_268;
  uint local_25c;
  long local_258;
  CRITICAL_SECTION *local_250;
  ulong local_248;
  void *local_240;
  _Deque_base<double,_std::allocator<double>_> local_238 [3];
  double local_138 [33];
  
  local_274 = 0;
  pCVar9 = RPLIDARCS;
  lVar5 = 0;
  local_270 = (void *)0x0;
  lVar7 = 0;
  while (*(void **)((long)addrsRPLIDAR + lVar5 * 2) != pParam) {
    pCVar9 = pCVar9 + 1;
    lVar7 = lVar7 + -0x50;
    local_270 = (void *)((long)local_270 + 0x10000);
    lVar5 = lVar5 + 4;
    if (lVar5 == 0x40) {
      return (void *)0x0;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)pCVar9);
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_Deque_base(local_238);
  this_00 = (deque<double,_std::allocator<double>_> *)((long)anglesvectorRPLIDAR + -lVar7);
  std::deque<double,_std::allocator<double>_>::_M_move_assign1(this_00,local_238);
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_258 = lVar5;
  local_250 = pCVar9;
  std::_Deque_base<double,_std::allocator<double>_>::_Deque_base(local_238);
  this = (deque<double,_std::allocator<double>_> *)((long)distancesvectorRPLIDAR - lVar7);
  std::deque<double,_std::allocator<double>_>::_M_move_assign1(this);
  pCVar9 = local_250;
  lVar5 = local_258;
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
  pthread_mutex_unlock((pthread_mutex_t *)pCVar9);
  local_240 = (void *)((long)distancesRPLIDAR[0] + (long)local_270);
  local_270 = (void *)((long)anglesRPLIDAR[0] + (long)local_270);
  local_268 = (_Deque_iterator<double,_double_&,_double_*> *)
              ((long)anglesvectorRPLIDAR + -lVar7 + 0x10);
  local_248 = 0;
  uVar6 = 0;
  local_278 = 0;
  do {
    memset(local_138,0,0x100);
    memset(local_238,0,0x100);
    local_25c = GetExpressScanDataResponseRPLIDAR
                          ((RPLIDAR *)pParam,local_138,(double *)local_238,&local_274);
    pthread_mutex_lock((pthread_mutex_t *)pCVar9);
    memcpy(local_240,local_138,0x100);
    memcpy(local_270,local_238,0x100);
    *(BOOL *)((long)bNewScanRPLIDAR + lVar5) = local_274;
    this_01 = local_268;
    for (lVar7 = 0; pCVar9 = local_250, lVar5 = local_258, lVar7 != 0x20; lVar7 = lVar7 + 1) {
      uVar2 = uVar6;
      if ((*(int *)((long)pParam + 0x6c8) == 0) &&
         (sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00), 4 < (int)sVar3)) {
        ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar7];
        sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           (this_01,(long)((int)sVar3 + -5));
        if (3.141592653589793 < (double)ppdVar1 - *pdVar4) {
          ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar7];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
          pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                             (this_01,(long)((int)sVar3 + -4));
          if (3.141592653589793 < (double)ppdVar1 - *pdVar4) {
            ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar7];
            sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
            pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                               (this_01,(long)((int)sVar3 + -3));
            if (3.141592653589793 < (double)ppdVar1 - *pdVar4) {
              ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar7];
              sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
              pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                 (this_01,(long)((int)sVar3 + -2));
              if (3.141592653589793 < (double)ppdVar1 - *pdVar4) {
                ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar7];
                sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
                pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                   (this_01,(long)((int)sVar3 + -1));
                if (3.141592653589793 < (double)ppdVar1 - *pdVar4) {
                  for (iVar8 = local_278 + ~uVar6; -1 < iVar8; iVar8 = iVar8 + -1) {
                    sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
                    if (0 < (int)sVar3) {
                      std::deque<double,_std::allocator<double>_>::pop_front(this_00);
                      std::deque<double,_std::allocator<double>_>::pop_front(this);
                    }
                  }
                  uVar2 = 0;
                  local_278 = uVar6;
                }
              }
            }
          }
        }
      }
      std::deque<double,_std::allocator<double>_>::push_back
                (this_00,(value_type *)(&local_238[0]._M_impl.super__Deque_impl_data._M_map + lVar7)
                );
      std::deque<double,_std::allocator<double>_>::push_back(this,local_138 + lVar7);
      iVar8 = *(int *)((long)pParam + 0x6c8);
      this_01 = local_268;
      uVar6 = uVar2;
      if (iVar8 == 0) {
        uVar6 = uVar2 + 1;
        if ((int)uVar2 < (int)local_278) {
          sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
          this_01 = local_268;
          if (0 < (int)sVar3) {
            std::deque<double,_std::allocator<double>_>::pop_front(this_00);
            std::deque<double,_std::allocator<double>_>::pop_front(this);
          }
          iVar8 = *(int *)((long)pParam + 0x6c8);
          goto LAB_0010f243;
        }
LAB_0010f25e:
        sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00);
        if (0x2000 < (int)sVar3) goto LAB_0010f26d;
      }
      else {
LAB_0010f243:
        if ((iVar8 < 1) ||
           (sVar3 = std::deque<double,_std::allocator<double>_>::size(this_00),
           (int)sVar3 <= *(int *)((long)pParam + 0x6c8))) goto LAB_0010f25e;
LAB_0010f26d:
        std::deque<double,_std::allocator<double>_>::pop_front(this_00);
        std::deque<double,_std::allocator<double>_>::pop_front(this);
      }
    }
    local_248 = local_248 & 0xffffffff;
    if (local_25c != 0) {
      local_248 = (ulong)local_25c;
    }
    *(int *)((long)resRPLIDAR + local_258) = (int)local_248;
    pthread_mutex_unlock((pthread_mutex_t *)local_250);
    if (*(int *)((long)bExitExpressScanRPLIDAR + lVar5) != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RPLIDARExpressScanThread(void* pParam)
{
	RPLIDAR* pRPLIDAR = (RPLIDAR*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	double distances[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	BOOL bNewScan = FALSE, bAutoNewScan = FALSE;
	int i = 0, j = 0, nb = 0, nbprev = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
	LeaveCriticalSection(&RPLIDARCS[id]);
#endif // __cplusplus

	for (;;)
	{
		//mSleep(pRPLIDAR->threadperiod);
		memset(distances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		memset(angles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		res = GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RPLIDARCS[id]);
			memcpy(distancesRPLIDAR[id], distances, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			memcpy(anglesRPLIDAR[id], angles, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			bNewScanRPLIDAR[id] = bNewScan;

#ifdef __cplusplus
			for (i = 0; i < NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; i++)
			{
				if (pRPLIDAR->maxhist == 0)
				{
					// Try to detect the beginning of a new scan with the angle discontinuity...
					// Try to be a little bit robust w.r.t. non-decreasing outliers...
					if (((int)anglesvectorRPLIDAR[id].size() >= 5)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-5]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-4]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-3]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-2]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-1]) > M_PI))
						bAutoNewScan = TRUE; else bAutoNewScan = FALSE;
					if (bAutoNewScan)
					{
						// Try to automatically remove old data...
						for (j = nbprev-nb-1; j >= 0; j--)
						{
							if ((int)anglesvectorRPLIDAR[id].size() > 0)
							{
								anglesvectorRPLIDAR[id].pop_front();
								distancesvectorRPLIDAR[id].pop_front();
							}
						}
						nbprev = nb;
						nb = 0;
					}
				}

				anglesvectorRPLIDAR[id].push_back(angles[i]);
				distancesvectorRPLIDAR[id].push_back(distances[i]);

				if (pRPLIDAR->maxhist == 0)
				{
					// Try to automatically remove old data...
					nb++;
					if ((nb <= nbprev)&&((int)anglesvectorRPLIDAR[id].size() > 0))
					{
						anglesvectorRPLIDAR[id].pop_front();
						distancesvectorRPLIDAR[id].pop_front();
					}
				}
				if (((pRPLIDAR->maxhist > 0)&&((int)anglesvectorRPLIDAR[id].size() > pRPLIDAR->maxhist))||
					((int)anglesvectorRPLIDAR[id].size() > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
				{
					anglesvectorRPLIDAR[id].pop_front();
					distancesvectorRPLIDAR[id].pop_front();
				}
			}
#endif // __cplusplus

			resRPLIDAR[id] = err;
			LeaveCriticalSection(&RPLIDARCS[id]);
		}
		if (bExitExpressScanRPLIDAR[id]) break;
	}

	return 0;
}